

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

double __thiscall
despot::BaseRockSample::StepReward(BaseRockSample *this,Belief *belief,ACT_TYPE action)

{
  double dVar1;
  long lVar2;
  long *plVar3;
  int i;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  plVar3 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  dVar5 = 0.0;
  uVar4 = 0;
  while( true ) {
    if ((ulong)(plVar3[1] - *plVar3 >> 3) <= uVar4) break;
    lVar2 = *(long *)(*plVar3 + uVar4 * 8);
    dVar1 = *(double *)(lVar2 + 0x18);
    dVar6 = (double)(**(code **)(*(long *)this + 0x28))(this,*(undefined4 *)(lVar2 + 0xc),action);
    dVar5 = dVar5 + dVar6 * dVar1;
    uVar4 = uVar4 + 1;
  }
  return dVar5;
}

Assistant:

double BaseRockSample::StepReward(const Belief* belief, ACT_TYPE action) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double value = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		value += particle->weight * Reward(particle->state_id, action);
	}

	return value;
}